

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O0

void Acb_ObjSetTruth(Acb_Ntk_t *p,int i,word x)

{
  word wVar1;
  word x_local;
  int i_local;
  Acb_Ntk_t *p_local;
  
  wVar1 = Acb_ObjTruth(p,i);
  if (wVar1 == 0) {
    Vec_WrdWriteEntry(&p->vObjTruth,i,x);
    return;
  }
  __assert_fail("Acb_ObjTruth(p, i) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                ,0x11d,"void Acb_ObjSetTruth(Acb_Ntk_t *, int, word)");
}

Assistant:

static inline void           Acb_ObjSetTruth( Acb_Ntk_t * p, int i, word x )         { assert(Acb_ObjTruth(p, i) == 0); Vec_WrdWriteEntry( &p->vObjTruth, i, x );                           }